

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidr.c++
# Opt level: O1

CidrRange *
kj::CidrRange::inet6
          (CidrRange *__return_storage_ptr__,ArrayPtr<const_unsigned_short> prefix,
          ArrayPtr<const_unsigned_short> suffix,uint bitCount)

{
  size_t i;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  ArrayPtr<const_unsigned_char> bits_00;
  byte bits [16];
  Fault f;
  DebugComparison<unsigned_long,_int> local_38;
  Fault local_10;
  
  sVar3 = suffix.size_;
  sVar2 = prefix.size_;
  local_38.left = sVar3 + sVar2;
  local_38.right = 8;
  local_38.op.content.ptr = " <= ";
  local_38.op.content.size_ = 5;
  local_38.result = local_38.left < 9;
  if (local_38.result) {
    local_38.left = 0;
    local_38.right = 0;
    local_38._12_4_ = 0;
    if (sVar2 != 0) {
      sVar1 = 0;
      do {
        *(unsigned_short *)((long)&local_38.left + sVar1 * 2) =
             prefix.ptr[sVar1] << 8 | prefix.ptr[sVar1] >> 8;
        sVar1 = sVar1 + 1;
      } while (sVar2 != sVar1);
    }
    if (sVar3 != 0) {
      sVar2 = 0;
      do {
        *(unsigned_short *)((long)&local_38 + sVar2 * 2 + sVar3 * -2 + 0x10) =
             suffix.ptr[sVar2] << 8 | suffix.ptr[sVar2] >> 8;
        sVar2 = sVar2 + 1;
      } while (sVar3 != sVar2);
    }
    bits_00.size_ = 0x10;
    bits_00.ptr = (uchar *)&local_38;
    CidrRange(__return_storage_ptr__,10,bits_00,bitCount);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
            (&local_10,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/cidr.c++"
             ,0x5c,FAILED,"prefix.size() + suffix.size() <= 8","_kjCondition,",&local_38);
  kj::_::Debug::Fault::fatal(&local_10);
}

Assistant:

CidrRange CidrRange::inet6(
    ArrayPtr<const uint16_t> prefix, ArrayPtr<const uint16_t> suffix,
    uint bitCount) {
  KJ_REQUIRE(prefix.size() + suffix.size() <= 8);

  byte bits[16] = { 0,0,0,0, 0,0,0,0, 0,0,0,0, 0,0,0,0, };

  for (size_t i: kj::indices(prefix)) {
    bits[i * 2] = prefix[i] >> 8;
    bits[i * 2 + 1] = prefix[i] & 0xff;
  }

  byte* suffixBits = bits + (16 - suffix.size() * 2);
  for (size_t i: kj::indices(suffix)) {
    suffixBits[i * 2] = suffix[i] >> 8;
    suffixBits[i * 2 + 1] = suffix[i] & 0xff;
  }

  return CidrRange(AF_INET6, bits, bitCount);
}